

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

ArrayPtr<const_capnp::word> __thiscall
capnp::FlatArrayMessageReader::getSegment(FlatArrayMessageReader *this,uint id)

{
  ArrayPtr<const_capnp::word> *pAVar1;
  word *pwVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  size_t sVar4;
  ArrayPtr<const_capnp::word> AVar5;
  
  if (id == 0) {
    pAVar3 = &this->segment0;
    pAVar1 = &this->segment0;
  }
  else {
    pwVar2 = (word *)0x0;
    sVar4 = 0;
    if ((this->moreSegments).size_ < (ulong)id) goto LAB_0018f133;
    pAVar1 = (this->moreSegments).ptr;
    pAVar3 = pAVar1 + (id - 1);
    pAVar1 = pAVar1 + (id - 1);
  }
  pwVar2 = pAVar3->ptr;
  sVar4 = pAVar1->size_;
LAB_0018f133:
  AVar5.size_ = sVar4;
  AVar5.ptr = pwVar2;
  return AVar5;
}

Assistant:

kj::ArrayPtr<const word> FlatArrayMessageReader::getSegment(uint id) {
  if (id == 0) {
    return segment0;
  } else if (id <= moreSegments.size()) {
    return moreSegments[id - 1];
  } else {
    return nullptr;
  }
}